

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommands.cxx
# Opt level: O2

void GetPredefinedCommands(vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands)

{
  cmExportCommand *pcVar1;
  cmExportCommand *local_38;
  
  local_38 = (cmExportCommand *)operator_new(0x50);
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005988e0
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00598968
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005989f0
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00598a78
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00598b00
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(800);
  cmExportCommand::cmExportCommand(pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x78);
  cmExportLibraryDependenciesCommand::cmExportLibraryDependenciesCommand
            ((cmExportLibraryDependenciesCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x88);
  cmFLTKWrapUICommand::cmFLTKWrapUICommand((cmFLTKWrapUICommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00598cb0
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0xa0);
  cmInstallProgramsCommand::cmInstallProgramsCommand((cmInstallProgramsCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00598dc0
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0xa0);
  cmLoadCacheCommand::cmLoadCacheCommand((cmLoadCacheCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x90);
  cmOutputRequiredFilesCommand::cmOutputRequiredFilesCommand((cmOutputRequiredFilesCommand *)pcVar1)
  ;
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00598f58
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00598fe0
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00599068
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005990f0
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00599178
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00599200
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x78);
  cmTargetCompileDefinitionsCommand::cmTargetCompileDefinitionsCommand
            ((cmTargetCompileDefinitionsCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x78);
  cmTargetCompileFeaturesCommand::cmTargetCompileFeaturesCommand
            ((cmTargetCompileFeaturesCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x78);
  cmTargetCompileOptionsCommand::cmTargetCompileOptionsCommand
            ((cmTargetCompileOptionsCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x78);
  cmTargetIncludeDirectoriesCommand::cmTargetIncludeDirectoriesCommand
            ((cmTargetIncludeDirectoriesCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x78);
  cmTargetSourcesCommand::cmTargetSourcesCommand((cmTargetSourcesCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005995f8
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00599680
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00599708
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmExportCommand *)operator_new(0x80);
  cmVariableWatchCommand::cmVariableWatchCommand((cmVariableWatchCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005997a8
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmExportCommand *)operator_new(0x50);
  (local_38->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_38->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCommand).Error.field_2;
  (local_38->super_cmCommand).Error._M_string_length = 0;
  (local_38->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCommand).Enabled = true;
  (local_38->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_00599830
  ;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  return;
}

Assistant:

void GetPredefinedCommands(std::vector<cmCommand*>& commands)
{
commands.push_back(new cmAddCompileOptionsCommand);
commands.push_back(new cmAuxSourceDirectoryCommand);
commands.push_back(new cmBuildNameCommand);
commands.push_back(new cmCMakeHostSystemInformationCommand);
commands.push_back(new cmElseIfCommand);
commands.push_back(new cmExportCommand);
commands.push_back(new cmExportLibraryDependenciesCommand);
commands.push_back(new cmFLTKWrapUICommand);
commands.push_back(new cmIncludeExternalMSProjectCommand);
commands.push_back(new cmInstallProgramsCommand);
commands.push_back(new cmLinkLibrariesCommand);
commands.push_back(new cmLoadCacheCommand);
commands.push_back(new cmOutputRequiredFilesCommand);
commands.push_back(new cmQTWrapCPPCommand);
commands.push_back(new cmQTWrapUICommand);
commands.push_back(new cmRemoveCommand);
commands.push_back(new cmRemoveDefinitionsCommand);
commands.push_back(new cmSourceGroupCommand);
commands.push_back(new cmSubdirDependsCommand);
commands.push_back(new cmTargetCompileDefinitionsCommand);
commands.push_back(new cmTargetCompileFeaturesCommand);
commands.push_back(new cmTargetCompileOptionsCommand);
commands.push_back(new cmTargetIncludeDirectoriesCommand);
commands.push_back(new cmTargetSourcesCommand);
commands.push_back(new cmUseMangledMesaCommand);
commands.push_back(new cmUtilitySourceCommand);
commands.push_back(new cmVariableRequiresCommand);
commands.push_back(new cmVariableWatchCommand);
commands.push_back(new cmWriteFileCommand);
commands.push_back(new cmLoadCommandCommand);

}